

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.hpp
# Opt level: O3

void __thiscall helics::FederateState::sleeplock(FederateState *this)

{
  __atomic_flag_data_type _Var1;
  int iVar2;
  
  LOCK();
  _Var1 = (this->processing).super___atomic_flag_base._M_i;
  (this->processing).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var1 != false) {
    iVar2 = 10000;
    do {
      LOCK();
      _Var1 = (this->processing).super___atomic_flag_base._M_i;
      (this->processing).super___atomic_flag_base._M_i = true;
      UNLOCK();
      if (_Var1 == false) {
        return;
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    while( true ) {
      LOCK();
      _Var1 = (this->processing).super___atomic_flag_base._M_i;
      (this->processing).super___atomic_flag_base._M_i = true;
      UNLOCK();
      if (_Var1 == false) break;
      sched_yield();
    }
  }
  return;
}

Assistant:

void sleeplock() const
    {
        if (!processing.test_and_set()) {
            return;
        }
        // spin for 10000 tries
        for (int ii = 0; ii < 10000; ++ii) {
            if (!processing.test_and_set()) {
                return;
            }
        }
        while (processing.test_and_set()) {
            std::this_thread::yield();
        }
    }